

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O2

int mriStep_SetPredictorMethod(ARKodeMem ark_mem,int pred_method)

{
  int iVar1;
  ARKodeMRIStepMem step_mem;
  ARKodeMRIStepMem local_10;
  
  iVar1 = mriStep_AccessStepMem(ark_mem,"mriStep_SetPredictorMethod",&local_10);
  if (iVar1 == 0) {
    local_10->predictor = pred_method;
  }
  return iVar1;
}

Assistant:

int mriStep_SetPredictorMethod(ARKodeMem ark_mem, int pred_method)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* set parameter */
  step_mem->predictor = pred_method;

  return (ARK_SUCCESS);
}